

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O3

sha1 * __thiscall pstore::http::sha1::input(sha1 *this,span<const_unsigned_char,__1L> *span)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  reference ptVar4;
  iterator __begin2;
  iterator __end2;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_40;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_30;
  
  if ((((span->storage_).data_ != (pointer)0x0) && (this->computed_ == false)) &&
     (this->corrupted_ == false)) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    span_iterator(&local_40,span,0);
    pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
    span_iterator(&local_30,span,(span->storage_).super_extent_type<_1L>.size_);
    if ((local_40.span_ != local_30.span_) || (local_40.index_ != local_30.index_)) {
      do {
        ptVar4 = pstore::gsl::details::
                 span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::operator*
                           (&local_40);
        uVar3 = this->index_;
        (this->message_block_)._M_elems[uVar3] = *ptVar4;
        uVar3 = uVar3 + 1;
        this->index_ = uVar3;
        puVar1 = &this->length_;
        uVar2 = *puVar1;
        *puVar1 = *puVar1 + 8;
        if (0xfffffffffffffff7 < uVar2) {
          this->corrupted_ = true;
          return this;
        }
        if (uVar3 == 0x40) {
          process_message_block(this);
        }
        pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
        operator++(&local_40);
      } while ((local_40.span_ != local_30.span_) || (local_40.index_ != local_30.index_));
    }
  }
  return this;
}

Assistant:

sha1 & sha1::input (gsl::span<std::uint8_t const> const & span) noexcept {
            if (span.data () == nullptr || computed_ || corrupted_) {
                return *this;
            }

            for (std::uint8_t const b : span) {
                message_block_[index_] = b;
                ++index_;

                auto const old_length = length_;
                length_ += 8;
                if (length_ < old_length) { // Detect overflow.
                    corrupted_ = true;      // Message is too long.
                    break;
                }

                if (index_ == 64) {
                    this->process_message_block ();
                }
            }
            return *this;
        }